

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O0

void __thiscall
duckdb::vector<duckdb::ColumnDefinition,_true>::erase_at
          (vector<duckdb::ColumnDefinition,_true> *this,idx_t idx)

{
  vector<duckdb::ColumnDefinition,_true> *pvVar1;
  undefined8 uVar2;
  vector<duckdb::ColumnDefinition,_true> *in_RSI;
  vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_> *in_RDI;
  unsigned_long in_stack_ffffffffffffffc8;
  unsigned_long in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  InternalException *in_stack_ffffffffffffffe0;
  
  pvVar1 = (vector<duckdb::ColumnDefinition,_true> *)
           ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::size
                     (in_RDI);
  if (pvVar1 < in_RSI) {
    uVar2 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffd0,"Can\'t remove offset %d from vector of size %d",
               (allocator *)&stack0xffffffffffffffcf);
    ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::size(in_RDI)
    ;
    InternalException::InternalException<unsigned_long,unsigned_long>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffc8);
    __cxa_throw(uVar2,&InternalException::typeinfo,InternalException::~InternalException);
  }
  unsafe_erase_at(in_RSI,(idx_t)in_RDI);
  return;
}

Assistant:

void erase_at(idx_t idx) { // NOLINT: not using camelcase on purpose here
		if (MemorySafety<SAFE>::ENABLED && idx > original::size()) {
			throw InternalException("Can't remove offset %d from vector of size %d", idx, original::size());
		}
		unsafe_erase_at(idx);
	}